

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LoopLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_loop(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LoopLayerParams *pLVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x267) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x267;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pLVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LoopLayerParams>
                       (arena);
    (this->layer_).loop_ = pLVar2;
  }
  return (LoopLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopLayerParams* NeuralNetworkLayer::_internal_mutable_loop() {
  if (!_internal_has_loop()) {
    clear_layer();
    set_has_loop();
    layer_.loop_ = CreateMaybeMessage< ::CoreML::Specification::LoopLayerParams >(GetArenaForAllocation());
  }
  return layer_.loop_;
}